

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::SectionStats::SectionStats
          (SectionStats *this,SectionInfo *_sectionInfo,Counts *_assertions,
          double _durationInSeconds,bool _missingAssertions)

{
  pointer pcVar1;
  size_t sVar2;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_00172ff0;
  (this->sectionInfo).name._M_dataplus._M_p = (pointer)&(this->sectionInfo).name.field_2;
  pcVar1 = (_sectionInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sectionInfo,pcVar1,pcVar1 + (_sectionInfo->name)._M_string_length);
  (this->sectionInfo).description._M_dataplus._M_p =
       (pointer)&(this->sectionInfo).description.field_2;
  pcVar1 = (_sectionInfo->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sectionInfo).description,pcVar1,
             pcVar1 + (_sectionInfo->description)._M_string_length);
  (this->sectionInfo).lineInfo.file._M_dataplus._M_p =
       (pointer)&(this->sectionInfo).lineInfo.file.field_2;
  pcVar1 = (_sectionInfo->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sectionInfo).lineInfo,pcVar1,
             pcVar1 + (_sectionInfo->lineInfo).file._M_string_length);
  (this->sectionInfo).lineInfo.line = (_sectionInfo->lineInfo).line;
  sVar2 = _assertions->failed;
  (this->assertions).passed = _assertions->passed;
  (this->assertions).failed = sVar2;
  (this->assertions).failedButOk = _assertions->failedButOk;
  this->durationInSeconds = _durationInSeconds;
  this->missingAssertions = _missingAssertions;
  return;
}

Assistant:

SectionStats(   SectionInfo const& _sectionInfo,
                        Counts const& _assertions,
                        double _durationInSeconds,
                        bool _missingAssertions )
        :   sectionInfo( _sectionInfo ),
            assertions( _assertions ),
            durationInSeconds( _durationInSeconds ),
            missingAssertions( _missingAssertions )
        {}